

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void udp_example(void)

{
  shared_ptr<spdlog::logger> my_logger;
  udp_sink_config cfg;
  udp_sink_config *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  uint16_t port;
  udp_sink_config *this;
  logger *this_00;
  executor *in_stack_fffffffffffffd90;
  udp_sink_config *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  undefined1 local_91 [72];
  undefined1 local_49 [73];
  
  port = (uint16_t)((ulong)in_stack_fffffffffffffd80 >> 0x30);
  this_00 = (logger *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"127.0.0.1",(allocator *)this_00);
  spdlog::sinks::udp_sink_config::udp_sink_config
            ((udp_sink_config *)in_stack_fffffffffffffd90,(string *)this_00,port);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  this = (udp_sink_config *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),"udplog",(allocator *)this);
  spdlog::sinks::udp_sink_config::udp_sink_config(this,in_stack_fffffffffffffd78);
  spdlog::udp_logger_mt<spdlog::synchronous_factory>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  spdlog::sinks::udp_sink_config::~udp_sink_config((udp_sink_config *)0x10eb2a);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10eb51);
  spdlog::logger::set_level(this_00,(level_enum)((ulong)this >> 0x20));
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10eb6d);
  spdlog::logger::info<char[12]>(this_00,(char (*) [12])this);
  spdlog::details::executor::~executor(in_stack_fffffffffffffd90);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10eb9c);
  spdlog::sinks::udp_sink_config::~udp_sink_config((udp_sink_config *)0x10eba9);
  return;
}

Assistant:

void udp_example()
{
    spdlog::sinks::udp_sink_config cfg("127.0.0.1", 11091);
    auto my_logger = spdlog::udp_logger_mt("udplog", cfg);
    my_logger->set_level(spdlog::level::debug);
    my_logger->info("hello world");
}